

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O2

void eltcalc::GetEventRates(void)

{
  FILE *pFVar1;
  int date_opts;
  occurrence occ;
  
  pFVar1 = fopen("input/event_rates.csv","r");
  if (pFVar1 != (FILE *)0x0) {
    GetEventRates((FILE *)pFVar1);
    return;
  }
  pFVar1 = fopen("input/occurrence.bin","rb");
  if (pFVar1 != (FILE *)0x0) {
    date_opts = 0;
    fread(&date_opts,4,1,pFVar1);
    if ((uint)date_opts < 2) {
      GetEventRates<occurrence>(&occ,(FILE *)pFVar1);
    }
    else {
      GetEventRates<occurrence_granular>((occurrence_granular *)&occ,(FILE *)pFVar1);
    }
    return;
  }
  fprintf(_stderr,"FATAL: %s: Error opening file %s\n","GetEventRates","input/occurrence.bin");
  exit(1);
}

Assistant:

void GetEventRates()
	{
		// Extract event rates from event rates file if it exists
		FILE *fin = fopen(EVENTRATES_FILE, "r");
		if (fin != nullptr) {
			GetEventRates(fin);
			return;
		}

		// Otherwise calculate event rates from occurrence file
		fin = fopen(OCCURRENCE_FILE, "rb");
		if (fin == nullptr) {
			fprintf(stderr, "FATAL: %s: Error opening file %s\n",
				__func__, OCCURRENCE_FILE);
			exit(EXIT_FAILURE);
		}

		int date_opts = 0;
		fread(&date_opts, sizeof(date_opts), 1, fin);
		int granular_date = date_opts >> 1;
		if (granular_date) {
			occurrence_granular occ;
			GetEventRates(occ, fin);
		} else {
			occurrence occ;
			GetEventRates(occ, fin);
		}
	}